

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_open_dictionary(ion_dictionary_handler_t *handler,ion_dictionary_t *dictionary,
                             ion_dictionary_id_t id)

{
  undefined1 local_48 [8];
  ion_dictionary_config_info_t config;
  ion_err_t err;
  ion_dictionary_id_t id_local;
  ion_dictionary_t *dictionary_local;
  ion_dictionary_handler_t *handler_local;
  
  config._28_4_ = id;
  config.dictionary_type._3_1_ =
       ion_lookup_in_master_table(id,(ion_dictionary_config_info_t *)local_48);
  if (config.dictionary_type._3_1_ == dictionary_type_bpp_tree_t >> 0x18) {
    ion_switch_handler(config.value_size,handler);
    handler_local._7_1_ =
         dictionary_open(handler,dictionary,(ion_dictionary_config_info_t *)local_48);
  }
  else {
    handler_local._7_1_ = '\x12';
  }
  return handler_local._7_1_;
}

Assistant:

ion_err_t
ion_open_dictionary(
	ion_dictionary_handler_t	*handler,		/* Passed in empty, to be set. */
	ion_dictionary_t			*dictionary,	/* Passed in empty, to be set. */
	ion_dictionary_id_t			id
) {
	ion_err_t						err;
	ion_dictionary_config_info_t	config;

	err = ion_lookup_in_master_table(id, &config);

	/* Lookup for id failed. */
	if (err_ok != err) {
		return err_uninitialized;
	}

	ion_switch_handler(config.dictionary_type, handler);

	err = dictionary_open(handler, dictionary, &config);

	return err;
}